

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O0

void __thiscall xray_re::xr_sector_object::load(xr_sector_object *this,xr_reader *r)

{
  size_t sVar1;
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_sector_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar1 = xr_reader::r_chunk<unsigned_short>(r,0xf010,(unsigned_short *)((long)&s + 6));
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x1e,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  if (s._6_2_ != 0x11) {
    __assert_fail("version == SECTOR_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x1f,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  sVar1 = xr_reader::r_chunk<xray_re::_color<float>>
                    (pxStack_18,0xf020,(_color<float> *)&(this->super_xr_custom_object).field_0x6c);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x22,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  sVar1 = xr_reader::r_chunk<unsigned_char>(pxStack_18,0xf025,&this->m_private);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                  ,0x24,"virtual void xray_re::xr_sector_object::load(xr_reader &)");
  }
  local_28 = xr_reader::open_chunk(pxStack_18,0xf030);
  if (local_28 != (xr_reader *)0x0) {
    xr_reader::
    r_chunks<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,read_item>
              (local_28,&this->m_items);
    xr_reader::close_chunk(pxStack_18,&local_28);
  }
  return;
}

Assistant:

void xr_sector_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SECTOR_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SECTOR_VERSION);
	xr_custom_object::load(r);
	if (!r.r_chunk<fcolor>(SECTOR_CHUNK_COLOR, m_color))
		xr_not_expected();
	if (!r.r_chunk<uint8_t>(SECTOR_CHUNK_PRIVATE, m_private))
		xr_not_expected();
	xr_reader* s = r.open_chunk(SECTOR_CHUNK_ITEMS);
	if (s) {
		s->r_chunks(m_items, read_item());
		r.close_chunk(s);
	}
}